

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::InitializeExecutionModeAndLimits
          (FunctionExecutionStateMachine *this,FunctionBody *functionBody)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint16 uVar4;
  ushort uVar5;
  DebuggerMode DVar6;
  uint uVar7;
  LocalFunctionId functionId;
  uint uVar8;
  FunctionBody **ppFVar9;
  undefined4 *puVar10;
  FunctionBody *pFVar11;
  uint *puVar12;
  double dStack_40;
  uint16 newFullJitThreshold;
  double fullJitDelayMultiplier;
  uint straightLineSize;
  uint uStack_2c;
  bool delayFullJITThisFunc;
  int byteCodeSizeThresholdForInlineCandidate;
  uint local_24;
  uint16 local_20;
  byte local_1d;
  uint loopPercentage;
  uint16 fullJitThresholdConfig;
  bool doInterpreterProfile;
  uint16 scale;
  bool isCoroutine;
  FunctionBody *functionBody_local;
  FunctionExecutionStateMachine *this_local;
  
  _fullJitThresholdConfig = functionBody;
  functionBody_local = (FunctionBody *)this;
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    DVar6 = FunctionBody::GetDebuggerMode(functionBody);
    this->initDebuggerMode = DVar6;
  }
  this->initializedExecutionModeAndLimits = true;
  ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__((WriteBarrierPtr *)this);
  if ((*ppFVar9 != (FunctionBody *)0x0) &&
     (ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__((WriteBarrierPtr *)this),
     *ppFVar9 != _fullJitThresholdConfig)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x4a,"(owner == nullptr || owner == functionBody)",
                                "owner == nullptr || owner == functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  Memory::WriteBarrierPtr<Js::FunctionBody>::operator=(&this->owner,_fullJitThresholdConfig);
  loopPercentage._3_1_ = FunctionBody::SkipAutoProfileForCoroutine(_fullJitThresholdConfig);
  this->interpreterLimit = 0;
  uVar4 = GetDefaultAutoProfilingInterpreter0Limit(this,(bool)loopPercentage._3_1_);
  this->autoProfilingInterpreter0Limit = uVar4;
  uVar4 = GetDefaultProfilingInterpreter0Limit(this,(bool)(loopPercentage._3_1_ & 1));
  this->profilingInterpreter0Limit = uVar4;
  uVar4 = GetDefaultAutoProfilingInterpreter1Limit(this,(bool)(loopPercentage._3_1_ & 1));
  this->autoProfilingInterpreter1Limit = uVar4;
  uVar4 = GetDefaultSimpleJitLimit(this,(bool)(loopPercentage._3_1_ & 1));
  this->simpleJitLimit = uVar4;
  uVar4 = GetDefaultProfilingInterpreter1Limit(this,(bool)(loopPercentage._3_1_ & 1));
  this->profilingInterpreter1Limit = uVar4;
  loopPercentage._0_2_ = 0;
  pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  local_1d = FunctionBody::DoInterpreterProfile(pFVar11);
  if ((bool)local_1d) {
    pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    bVar3 = FunctionBody::DoInterpreterAutoProfile(pFVar11);
    if (!bVar3) {
      loopPercentage._0_2_ =
           (ushort)loopPercentage +
           this->autoProfilingInterpreter0Limit + this->autoProfilingInterpreter1Limit;
      this->autoProfilingInterpreter0Limit = 0;
      this->autoProfilingInterpreter1Limit = 0;
      if ((DAT_01eafdac & 1) == 0) {
        this->simpleJitLimit = this->simpleJitLimit + this->profilingInterpreter0Limit;
        this->profilingInterpreter0Limit = 0;
      }
    }
  }
  else {
    loopPercentage._0_2_ =
         (ushort)loopPercentage +
         this->autoProfilingInterpreter0Limit + this->profilingInterpreter0Limit +
         this->autoProfilingInterpreter1Limit + this->profilingInterpreter1Limit;
    this->autoProfilingInterpreter0Limit = 0;
    this->profilingInterpreter0Limit = 0;
    this->autoProfilingInterpreter1Limit = 0;
    this->profilingInterpreter1Limit = 0;
  }
  pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  bVar3 = FunctionBody::DoSimpleJit(pFVar11);
  if (!bVar3) {
    if (((DAT_01eafdac & 1) == 0) && ((local_1d & 1) != 0)) {
      this->profilingInterpreter1Limit = this->profilingInterpreter1Limit + this->simpleJitLimit;
    }
    else {
      loopPercentage._0_2_ = (ushort)loopPercentage + this->simpleJitLimit;
    }
    this->simpleJitLimit = 0;
  }
  pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
  pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,uVar7,functionId);
  if (bVar3) {
    loopPercentage._0_2_ = (ushort)loopPercentage + this->profilingInterpreter1Limit;
    this->profilingInterpreter1Limit = 0;
  }
  local_20 = GetDefaultFullJitThreshold(this,(bool)(loopPercentage._3_1_ & 1));
  if ((DAT_01eafd98 & 1) == 0) {
    pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    uVar7 = FunctionBody::GetByteCodeInLoopCount(pFVar11);
    byteCodeSizeThresholdForInlineCandidate = 1;
    pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    uStack_2c = FunctionBody::GetByteCodeCount(pFVar11);
    puVar12 = max<unsigned_int>((uint *)&byteCodeSizeThresholdForInlineCandidate,
                                &stack0xffffffffffffffd4);
    uVar2 = DAT_01eace28;
    local_24 = (uVar7 * 100) / *puVar12;
    bVar3 = false;
    if (0 < DAT_01ea9f04) {
      pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
      uVar7 = FunctionBody::GetByteCodeWithoutLDACount(pFVar11);
      bVar3 = uVar7 <= uVar2;
    }
    if ((local_24 < 0x33) || (bVar3)) {
      pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
      uVar7 = FunctionBody::GetByteCodeCount(pFVar11);
      pFVar11 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
      uVar8 = FunctionBody::GetByteCodeInLoopCount(pFVar11);
      if (bVar3) {
        dStack_40 = (double)DAT_01ea9f04 / 10.0;
      }
      else if (uVar7 - uVar8 < 0x32) {
        dStack_40 = 1.2;
      }
      else if (uVar7 - uVar8 < 100) {
        dStack_40 = 1.4;
      }
      else {
        dStack_40 = 1.6;
      }
      uVar5 = (ushort)(int)((double)local_20 * dStack_40);
      loopPercentage._0_2_ = (ushort)loopPercentage + (uVar5 - local_20);
      local_20 = uVar5;
    }
  }
  if (local_20 < (ushort)loopPercentage) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0xb2,"(fullJitThresholdConfig >= scale)",
                                "fullJitThresholdConfig >= scale");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this->fullJitThreshold = local_20 - (ushort)loopPercentage;
  SetInterpretedCount(this,0);
  SetDefaultInterpreterExecutionMode(this);
  SetFullJitThreshold(this,local_20,false);
  TryTransitionToNextInterpreterExecutionMode(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::InitializeExecutionModeAndLimits(FunctionBody* functionBody)
    {
#if DBG
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!initializedExecutionModeAndLimits)
        {
            initDebuggerMode = functionBody->GetDebuggerMode();
        }
#endif
        initializedExecutionModeAndLimits = true;        
#endif
        // Assert we're either uninitialized, or being reinitialized on the same FunctionBody
        Assert(owner == nullptr || owner == functionBody);
        owner = functionBody;

        // AutoProfilingInterpreter might decide to not profile on the first run. For generator
        // functions, that means we will miss the profiling information on the first run when we resume
        // back to the function.
        const bool isCoroutine = functionBody->SkipAutoProfileForCoroutine();

        interpreterLimit               = 0;
        autoProfilingInterpreter0Limit = GetDefaultAutoProfilingInterpreter0Limit(isCoroutine);
        profilingInterpreter0Limit     = GetDefaultProfilingInterpreter0Limit(isCoroutine);
        autoProfilingInterpreter1Limit = GetDefaultAutoProfilingInterpreter1Limit(isCoroutine);
        simpleJitLimit                 = GetDefaultSimpleJitLimit(isCoroutine);
        profilingInterpreter1Limit     = GetDefaultProfilingInterpreter1Limit(isCoroutine);

        // Based on which execution modes are disabled, calculate the number of additional iterations that need to be covered by
        // the execution mode that will scale with the full JIT threshold
        uint16 scale = 0;
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        if (!doInterpreterProfile)
        {
            scale +=
                autoProfilingInterpreter0Limit +
                profilingInterpreter0Limit +
                autoProfilingInterpreter1Limit +
                profilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            profilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            profilingInterpreter1Limit = 0;
        }
        else if (!owner->DoInterpreterAutoProfile())
        {
            scale += autoProfilingInterpreter0Limit + autoProfilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                simpleJitLimit += profilingInterpreter0Limit;
                profilingInterpreter0Limit = 0;
            }
        }
        if (!owner->DoSimpleJit())
        {
            if (!CONFIG_FLAG(NewSimpleJit) && doInterpreterProfile)
            {
                // The old simple JIT is off, but since it does profiling, it will be replaced with the profiling interpreter
                profilingInterpreter1Limit += simpleJitLimit;
            }
            else
            {
                scale += simpleJitLimit;
            }
            simpleJitLimit = 0;
        }
        if (PHASE_OFF(FullJitPhase, owner))
        {
            scale += profilingInterpreter1Limit;
            profilingInterpreter1Limit = 0;
        }

        uint16 fullJitThresholdConfig = GetDefaultFullJitThreshold(isCoroutine);
        if (!Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            /*
            Scale the full JIT threshold based on some heuristics:
            - If the % of code in loops is > 50, scale by 1
            - Byte-code size of code outside loops
            - If the size is < 50, scale by 1.2
            - If the size is < 100, scale by 1.4
            - If the size is >= 100, scale by 1.6
            */
            const uint loopPercentage = owner->GetByteCodeInLoopCount() * 100 / max(1u, owner->GetByteCodeCount());
            const int byteCodeSizeThresholdForInlineCandidate = CONFIG_FLAG(LoopInlineThreshold);
            bool delayFullJITThisFunc =
                (CONFIG_FLAG(DelayFullJITSmallFunc) > 0) && (owner->GetByteCodeWithoutLDACount() <= (uint)byteCodeSizeThresholdForInlineCandidate);

            if (loopPercentage <= 50 || delayFullJITThisFunc)
            {
                const uint straightLineSize = owner->GetByteCodeCount() - owner->GetByteCodeInLoopCount();
                double fullJitDelayMultiplier;
                if (delayFullJITThisFunc)
                {
                    fullJitDelayMultiplier = CONFIG_FLAG(DelayFullJITSmallFunc) / 10.0;
                }
                else if (straightLineSize < 50)
                {
                    fullJitDelayMultiplier = 1.2;
                }
                else if (straightLineSize < 100)
                {
                    fullJitDelayMultiplier = 1.4;
                }
                else
                {
                    fullJitDelayMultiplier = 1.6;
                }

                const uint16 newFullJitThreshold = static_cast<uint16>(fullJitThresholdConfig * fullJitDelayMultiplier);
                scale += newFullJitThreshold - fullJitThresholdConfig;
                fullJitThresholdConfig = newFullJitThreshold;
            }
        }

        Assert(fullJitThresholdConfig >= scale);
        fullJitThreshold = fullJitThresholdConfig - scale;
        SetInterpretedCount(0);
        SetDefaultInterpreterExecutionMode();
        SetFullJitThreshold(fullJitThresholdConfig);
        TryTransitionToNextInterpreterExecutionMode();
    }